

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNNotInBase::fold_binop(CTPNNotInBase *this)

{
  CTcPrsNode *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  CTcConstVal *val;
  undefined4 extraout_var_01;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  
  iVar2 = (*(((this->super_CTPNBin).super_CTPNBinBase.left_)->super_CTcPrsNodeBase).
            _vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    pCVar1 = (this->super_CTPNBin).super_CTPNBinBase.right_;
    pp_Var5 = pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    while (pp_Var4 = pp_Var5, pp_Var4 != (_func_int **)0x0) {
      pp_Var5 = (_func_int **)pp_Var4[2];
      lVar3 = (**(code **)(*pp_Var4 + 8))(pp_Var4);
      if (lVar3 != 0) {
        iVar2 = (*(((this->super_CTPNBin).super_CTPNBinBase.left_)->super_CTcPrsNodeBase).
                  _vptr_CTcPrsNodeBase[1])();
        val = (CTcConstVal *)(**(code **)(*pp_Var4 + 8))(pp_Var4);
        iVar2 = CTcConstVal::is_equal_to((CTcConstVal *)CONCAT44(extraout_var_00,iVar2),val);
        if (iVar2 != 0) {
          this->field_0x18 = this->field_0x18 | 1;
          pp_Var5 = (_func_int **)0x0;
        }
        *(int *)&pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
             *(int *)&pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + -1;
        pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var5;
      }
    }
    if (pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase == (_func_int **)0x0) {
      iVar2 = (*(((this->super_CTPNBin).super_CTPNBinBase.left_)->super_CTcPrsNodeBase).
                _vptr_CTcPrsNodeBase[1])();
      *(uint *)CONCAT44(extraout_var_01,iVar2) = 2 - ((byte)this->field_0x18 & 1);
      this = (CTPNNotInBase *)(this->super_CTPNBin).super_CTPNBinBase.left_;
    }
  }
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTPNNotInBase::fold_binop()
{
    CTPNArglist *lst;
    CTPNArg *arg;
    CTPNArg *prv;
    CTPNArg *nxt;

    /* if the left-hand side isn't constant, there's nothing to do */
    if (!left_->is_const())
        return this;

    /* the right side is always an argument list */
    lst = (CTPNArglist *)right_;

    /* look for the value in the arguments */
    for (prv = 0, arg = lst->get_arg_list_head() ; arg != 0 ; arg = nxt)
    {
        /* remember the next argument, in case we eliminate this one */
        nxt = arg->get_next_arg();

        /* check to see if this argument is a constant */
        if (arg->is_const())
        {
            /*
             *   This one's a constant, so check to see if we found the
             *   left side value.  If the left side equals this value,
             *   note that we found the value.
             */
            if (left_->get_const_val()->is_equal_to(arg->get_const_val()))
            {
                /*
                 *   The values are equal, so the result of the expression
                 *   is definitely 'nil'.  
                 */
                const_false_ = TRUE;

                /*
                 *   Because the 'not in' operator only evaluates operands
                 *   from the 'in' list until it finds one that matches,
                 *   any remaining operands will simply never be
                 *   evaluated.  We can thus discard the rest of the
                 *   argument list.  
                 */
                nxt = 0;
            }

            /*
             *   We now know whether the left side equals this constant
             *   list element.  This is never going to change because both
             *   values are constant, so there's no point in making this
             *   same comparison over and over again at run-time.  We can
             *   thus eliminate this argument from the list.  
             */
            lst->set_argc(lst->get_argc() - 1);
            if (prv == 0)
                lst->set_arg_list_head(nxt);
            else
                prv->set_next_arg(nxt);
        }
    }

    /*
     *   If the argument list is now completely empty, the result of the
     *   expression is a constant.  
     */
    if (lst->get_arg_list_head() == 0)
    {
        /* set the left operand's value to our result */
        left_->get_const_val()->set_bool(!const_false_);
        
        /* return the constant value in place of the entire expression */
        return left_;
    }

    /* we're not a constant, to return myself unchanged */
    return this;
}